

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall
cs_impl::any::make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
          (any *this,numeric *args,numeric *args_1,numeric *args_2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  baseHolder *pbVar9;
  proxy *ppVar10;
  
  if ((DAT_0033c6e8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar9 = (baseHolder *)operator_new(0x70);
  }
  else {
    pbVar9 = *(baseHolder **)
              (&holder<std::shared_ptr<cs::name_space>>::allocator + DAT_0033c6e8 * 8);
    DAT_0033c6e8 = DAT_0033c6e8 + -1;
  }
  pbVar9->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0032b498;
  bVar1 = args->type;
  pp_Var4 = (_func_int **)(args_1->data)._int;
  pp_Var5 = *(_func_int ***)((long)&args_1->data + 8);
  bVar2 = args_1->type;
  pp_Var6 = (_func_int **)(args_2->data)._int;
  pp_Var7 = *(_func_int ***)((long)&args_2->data + 8);
  bVar3 = args_2->type;
  pp_Var8 = *(_func_int ***)((long)&args->data + 8);
  pbVar9[2]._vptr_baseHolder = (_func_int **)(args->data)._int;
  pbVar9[3]._vptr_baseHolder = pp_Var8;
  *(bool *)&pbVar9[4]._vptr_baseHolder = bVar1;
  pbVar9[6]._vptr_baseHolder = pp_Var4;
  pbVar9[7]._vptr_baseHolder = pp_Var5;
  *(bool *)&pbVar9[8]._vptr_baseHolder = bVar2;
  pbVar9[10]._vptr_baseHolder = pp_Var6;
  pbVar9[0xb]._vptr_baseHolder = pp_Var7;
  *(bool *)&pbVar9[0xc]._vptr_baseHolder = bVar3;
  if ((DAT_0033beb0 == 0) || (cs::global_thread_counter != 0)) {
    ppVar10 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar10 = (proxy *)(&cs::null_pointer)[DAT_0033beb0];
    DAT_0033beb0 = DAT_0033beb0 + -1;
  }
  ppVar10->is_rvalue = false;
  ppVar10->protect_level = 2;
  ppVar10->refcount = 1;
  ppVar10->data = pbVar9;
  this->mDat = ppVar10;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}